

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

int __thiscall ProtocolARP::LocateProtocolAddress(ProtocolARP *this,uint8_t *protocolAddress)

{
  size_t sVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  uint8_t *protocolAddress_local;
  ProtocolARP *this_local;
  
  local_24 = 0;
  do {
    if (4 < local_24) {
      return -1;
    }
    sVar1 = ProtocolIPv4::AddressSize(this->IP);
    local_28 = (int)sVar1;
    do {
      local_28 = local_28 + -1;
      if (local_28 < 0) break;
    } while (this->Cache[local_24].IPv4Address[local_28] == protocolAddress[local_28]);
    if (local_28 == -1) {
      return local_24;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int ProtocolARP::LocateProtocolAddress(const uint8_t* protocolAddress)
{
    int i;
    int j;

    for (i = 0; i < ARPCacheSize; i++)
    {
        // Go through the address backwards since least significant byte is most
        // likely to be unique
        for (j = IP.AddressSize() - 1; j >= 0; j--)
        {
            if (Cache[i].IPv4Address[j] != protocolAddress[j])
            {
                break;
            }
        }
        if (j == -1)
        {
            // found
            return i;
        }
    }

    return -1;
}